

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

char * cutToWhiteSpace(char *s,uint offset,char *sbuf)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar5;
  
  if (s == (char *)0x0) {
    *sbuf = '\0';
  }
  else {
    uVar7 = (ulong)offset;
    sVar3 = strlen(s);
    if (uVar7 < sVar3) {
      uVar4 = 0;
      uVar5 = uVar4;
      if (offset != 0) {
        do {
          uVar5 = uVar4;
          if (s[uVar4] == '\n') break;
          uVar4 = uVar4 + 1;
          uVar5 = uVar7;
        } while (uVar7 != uVar4);
      }
      uVar2 = (uint)uVar5;
      if (uVar2 == offset) {
        bVar8 = offset == 0;
        uVar6 = offset;
        uVar2 = offset;
        if ((!bVar8) && (s[uVar7] != ' ')) {
          uVar1 = offset - 1;
          do {
            uVar6 = uVar1;
            bVar8 = uVar6 == 0;
            if (bVar8) {
              uVar6 = 0;
              uVar2 = offset;
              break;
            }
            uVar2 = uVar6;
            uVar1 = uVar6 - 1;
          } while (s[uVar6] != ' ');
        }
        uVar6 = uVar6 + 1;
        if (bVar8) {
          uVar6 = offset;
        }
      }
      else {
        uVar6 = uVar2 + 1;
      }
      strncpy(sbuf,s,(ulong)uVar2);
      sbuf[uVar2] = '\0';
      return s + uVar6;
    }
    strcpy(sbuf,s);
    sbuf[uVar7] = '\0';
  }
  return (char *)0x0;
}

Assistant:

static const char *cutToWhiteSpace(const char *s, uint offset, char *sbuf)
{
    if (!s)
    {
        sbuf[0] = '\0';
        return NULL;
    }
    else if (strlen(s) <= offset)
    {
        strcpy(sbuf,s);
        sbuf[offset] = '\0';
        return NULL;
    }
    else
    {
        uint j, l, n;
        /* scan forward looking for newline */
        j = 0;
        while(j < offset && s[j] != '\n')
            ++j;
        if ( j == offset ) {
            /* scan backward looking for first space */
            j = offset;
            while(j && s[j] != ' ')
                --j;
            l = j;
            n = j+1;
            /* no white space */
            if (j==0)
            {
                l = offset;
                n = offset;
            }
        } else
        {
            l = j;
            n = j+1;
        }
        strncpy(sbuf,s,l);
        sbuf[l] = '\0';
        return s+n;
    }
}